

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall
CTPNSymDebugLocalBase::CTPNSymDebugLocalBase(CTPNSymDebugLocalBase *this,tcprsdbg_sym_info *info)

{
  (this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_00354618;
  if (info->sym_type == TC_SYM_PARAM) {
    this->var_id_ = info->var_id;
    this->ctx_arr_idx_ = 0;
    this->frame_idx_ = info->frame_idx;
    this->field_0x14 = this->field_0x14 | 1;
  }
  else if (info->sym_type == TC_SYM_LOCAL) {
    this->var_id_ = info->var_id;
    this->ctx_arr_idx_ = info->ctx_arr_idx;
    this->frame_idx_ = info->frame_idx;
    this->field_0x14 = this->field_0x14 & 0xfe;
    return;
  }
  return;
}

Assistant:

CTPNSymDebugLocalBase::CTPNSymDebugLocalBase(const tcprsdbg_sym_info *info)
{
    /* save the type information */
    switch(info->sym_type)
    {
    case TC_SYM_LOCAL:
        var_id_ = info->var_id;
        ctx_arr_idx_ = info->ctx_arr_idx;
        frame_idx_ = info->frame_idx;
        is_param_ = FALSE;
        break;

    case TC_SYM_PARAM:
        var_id_ = info->var_id;
        ctx_arr_idx_ = 0;
        frame_idx_ = info->frame_idx;
        is_param_ = TRUE;
        break;

    default:
        /* other types are invalid */
        assert(FALSE);
        break;
    }
}